

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O2

BOOL GetThreadContext(HANDLE hThread,LPCONTEXT lpContext)

{
  PAL_ERROR PVar1;
  DWORD dwProcessId;
  BOOL BVar2;
  CPalThread *pThread;
  PAL_ERROR *pPVar3;
  int *piVar4;
  CPalThread *local_40;
  CPalThread *pTargetThread;
  IPalObject *pobjThread;
  
  pTargetThread = (CPalThread *)0x0;
  if (PAL_InitializeChakraCoreCalled) {
    pThread = CorUnix::InternalGetCurrentThread();
    BVar2 = 0;
    PVar1 = CorUnix::InternalGetThreadDataFromHandle
                      (pThread,hThread,0,&local_40,(IPalObject **)&pTargetThread);
    if (PVar1 == 0) {
      if (local_40->m_fIsDummy == false) {
        dwProcessId = GetCurrentProcessId();
        BVar2 = CONTEXT_GetThreadContext(dwProcessId,local_40->m_pthreadSelf,lpContext);
      }
      else {
        BVar2 = 0;
        fprintf(_stderr,"] %s %s:%d","GetThreadContext",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/debug/debug.cpp"
                ,0x1dd);
        fprintf(_stderr,"Dummy thread handle passed to GetThreadContext\n");
        piVar4 = __errno_location();
        *piVar4 = 6;
      }
    }
    else {
      pPVar3 = (PAL_ERROR *)__errno_location();
      *pPVar3 = PVar1;
    }
    if (pTargetThread != (CPalThread *)0x0) {
      (*pTargetThread->_vptr_CPalThread[8])(pTargetThread,pThread);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return BVar2;
    }
  }
  abort();
}

Assistant:

BOOL
PALAPI
GetThreadContext(
           IN HANDLE hThread,
           IN OUT LPCONTEXT lpContext)
{
    PAL_ERROR palError;
    CPalThread *pThread;
    CPalThread *pTargetThread;
    IPalObject *pobjThread = NULL;
    BOOL ret = FALSE;

    PERF_ENTRY(GetThreadContext);
    ENTRY("GetThreadContext (hThread=%p, lpContext=%p)\n",hThread,lpContext);

    pThread = InternalGetCurrentThread();

    palError = InternalGetThreadDataFromHandle(
        pThread,
        hThread,
        0, // THREAD_GET_CONTEXT
        &pTargetThread,
        &pobjThread
        );

    if (NO_ERROR == palError)
    {
        if (!pTargetThread->IsDummy())
        {
            ret = CONTEXT_GetThreadContext(
                GetCurrentProcessId(),
                pTargetThread->GetPThreadSelf(),
                lpContext
                );
        }
        else
        {
            ASSERT("Dummy thread handle passed to GetThreadContext\n");
            pThread->SetLastError(ERROR_INVALID_HANDLE);
        }
    }
    else
    {
        pThread->SetLastError(palError);
    }

    if (NULL != pobjThread)
    {
        pobjThread->ReleaseReference(pThread);
    }

    LOGEXIT("GetThreadContext returns ret:%d\n", ret);
    PERF_EXIT(GetThreadContext);
    return ret;
}